

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

llama_sampler * llama_sampler_init_temp_ext(float temp,float delta,float exponent)

{
  float *pfVar1;
  llama_sampler *plVar2;
  
  pfVar1 = (float *)operator_new(0xc);
  *pfVar1 = temp;
  pfVar1[1] = delta;
  pfVar1[2] = exponent;
  plVar2 = (llama_sampler *)operator_new(0x10);
  plVar2->iface = &llama_sampler_temp_ext_i;
  plVar2->ctx = pfVar1;
  return plVar2;
}

Assistant:

struct llama_sampler * llama_sampler_init_temp_ext(float temp, float delta, float exponent) {
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_temp_ext_i,
        /* .ctx   = */ new llama_sampler_temp_ext {
            /* .temp     = */ temp,
            /* .delta    = */ delta,
            /* .exponent = */ exponent,
        }
    );
}